

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

int __thiscall prometheus::Gateway::Delete(Gateway *this)

{
  int iVar1;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  iVar1 = detail::CurlWrapper::performHttpRequest
                    ((this->curlWrapper_)._M_t.
                     super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
                     .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>._M_head_impl,
                     Delete,&this->jobUri_,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int Gateway::Delete() {
  return curlWrapper_->performHttpRequest(detail::HttpMethod::Delete, jobUri_);
}